

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O3

int Sbd_ManCutIsTopo(Gia_Man_t *p,Vec_Int_t *vMirrors,Vec_Int_t *vCut,int iObj)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  
  Gia_ManIncrementTravId(p);
  if (0 < vCut->nSize) {
    piVar1 = vCut->pArray;
    lVar3 = 0;
    do {
      if (p->nTravIdsAlloc <= piVar1[lVar3]) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
      }
      p->pTravIds[piVar1[lVar3]] = p->nTravIds;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCut->nSize);
  }
  iVar2 = Sbd_ManCutIsTopo_rec(p,vMirrors,iObj);
  if (iVar2 != 0) {
    return 1;
  }
  printf("Cut of node %d is not tological\n",(ulong)(uint)iObj);
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                ,0x9c,"int Sbd_ManCutIsTopo(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManCutIsTopo( Gia_Man_t * p, Vec_Int_t * vMirrors, Vec_Int_t * vCut, int iObj )
{
    int i, Entry, RetValue;
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vCut, Entry, i )
        Gia_ObjSetTravIdCurrentId( p, Entry );        
    RetValue = Sbd_ManCutIsTopo_rec( p, vMirrors, iObj );
    if ( RetValue == 0 )
        printf( "Cut of node %d is not tological\n", iObj );
    assert( RetValue );
    return RetValue;
}